

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O0

size_t __thiscall shine::http::response::decode_header(response *this,int8 *data_,size_t len)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string *psVar4;
  char *pcVar5;
  uint16 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  uint64 uVar8;
  size_t *psVar9;
  bool local_95 [17];
  int local_84;
  undefined1 local_80 [8];
  entry_t entry;
  int8 *tmp;
  int8 *header_end;
  int8 *data;
  size_t len_local;
  int8 *data__local;
  response *this_local;
  
  pcVar3 = strstr(data_,"\r\n\r\n");
  if (pcVar3 == (char *)0x0) {
    this_local = (response *)0xffffffffffffffff;
  }
  else {
    entry._value.super_string.field_2._8_8_ = strstr(data_," ");
    if ((char *)entry._value.super_string.field_2._8_8_ == (char *)0x0) {
      this_local = (response *)0xffffffffffffffff;
    }
    else {
      psVar4 = http::header::get_version(&this->super_header);
      std::__cxx11::string::assign((char *)psVar4,(ulong)data_);
      pcVar5 = (char *)(entry._value.super_string.field_2._8_8_ + 1);
      entry._value.super_string.field_2._8_8_ = strstr(pcVar5," ");
      if ((char *)entry._value.super_string.field_2._8_8_ == (char *)0x0) {
        this_local = (response *)0xffffffffffffffff;
      }
      else {
        *(char *)entry._value.super_string.field_2._8_8_ = '\0';
        iVar2 = atoi(pcVar5);
        puVar6 = get_status_code(this);
        *puVar6 = (uint16)iVar2;
        pcVar5 = (char *)(entry._value.super_string.field_2._8_8_ + 1);
        entry._value.super_string.field_2._8_8_ = strstr(pcVar5,"\r\n");
        if ((char *)entry._value.super_string.field_2._8_8_ == (char *)0x0) {
          this_local = (response *)0xffffffffffffffff;
        }
        else {
          psVar4 = get_status_desc(this);
          std::__cxx11::string::assign((char *)psVar4,(ulong)pcVar5);
          header_end = (int8 *)(entry._value.super_string.field_2._8_8_ + 2);
          do {
            if (pcVar3 + 2 <= header_end) {
              return len;
            }
            entry_t::entry_t((entry_t *)local_80);
            entry._value.super_string.field_2._8_8_ = strstr(header_end,": ");
            if ((char *)entry._value.super_string.field_2._8_8_ == (char *)0x0) {
              this_local = (response *)0xffffffffffffffff;
              local_84 = 1;
              entry._value.super_string.field_2._8_8_ = 0;
            }
            else {
              psVar4 = entry_t::get_key((entry_t *)local_80);
              std::__cxx11::string::assign((char *)psVar4,(ulong)header_end);
              pcVar5 = (char *)(entry._value.super_string.field_2._8_8_ + 2);
              entry._value.super_string.field_2._8_8_ = strstr(pcVar5,"\r\n");
              psVar4 = entry_t::get_value((entry_t *)local_80);
              std::__cxx11::string::assign((char *)psVar4,(ulong)pcVar5);
              header_end = (int8 *)(entry._value.super_string.field_2._8_8_ + 2);
              pbVar7 = &entry_t::get_key((entry_t *)local_80)->super_string;
              bVar1 = std::operator==(pbVar7,"Content-Length");
              if (bVar1) {
                psVar4 = entry_t::get_value((entry_t *)local_80);
                uVar8 = shine::string::to_uint64(psVar4);
                psVar9 = http::header::get_content_length(&this->super_header);
                *psVar9 = uVar8;
              }
              else {
                pbVar7 = &entry_t::get_key((entry_t *)local_80)->super_string;
                bVar1 = std::operator==(pbVar7,"Transfer-Encoding");
                if (bVar1) {
                  pbVar7 = &entry_t::get_value((entry_t *)local_80)->super_string;
                  bVar1 = std::operator==(pbVar7,"chunked");
                  if (bVar1) {
                    local_95[0] = true;
                    set_is_chunk<bool>(this,local_95);
                    goto LAB_001b1b51;
                  }
                }
                http::header::add_entry(&this->super_header,(entry_t *)local_80);
              }
LAB_001b1b51:
              local_84 = 0;
            }
            entry_t::~entry_t((entry_t *)local_80);
          } while (local_84 == 0);
        }
      }
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t decode_header(const int8 *data_, size_t len)
            {
                int8 *data = (int8*)data_;
                int8 *header_end = strstr(data, "\r\n\r\n");
                if (header_end == NULL)
                    return -1;

                //decode version status code status desc
                int8 *tmp = strstr(data, " ");
                if (tmp == NULL)
                    return -1;

                get_version().assign(data, tmp - data);
                data = tmp + 1;

                tmp = strstr(data, " ");
                if (tmp == NULL)
                    return -1;

                *tmp = '\0';
                get_status_code() = atoi(data);
                data = tmp + 1;

                tmp = strstr(data, "\r\n");
                if (tmp == NULL)
                    return -1;

                get_status_desc().assign(data, tmp - data);
                data = tmp + 2;

                //decode other entrys
                while (data < header_end + 2)
                {
                    entry_t entry;
                    tmp = strstr(data, ": ");
                    if (tmp == NULL)
                        return -1;

                    entry.get_key().assign(data, tmp - data);
                    data = tmp + 2;

                    tmp = strstr(data, "\r\n");
                    entry.get_value().assign(data, tmp - data);
                    data = tmp + 2;

					if (entry.get_key() == "Content-Length")
						get_content_length() = entry.get_value().to_uint64();
					else if (entry.get_key() == "Transfer-Encoding" && entry.get_value() == "chunked")
						set_is_chunk(true);
                    else
                        add_entry(std::move(entry));
                }

                return len;
            }